

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChFilterPDT1::Config(ChFilterPDT1 *this,double step,double Td1,double T1,double Kp)

{
  (this->super_ChAnalogueFilter).m_step = step;
  (this->pd1).m_Td1 = Td1;
  (this->pd1).m_Kdt1 = 1.0;
  (this->pd1).super_ChAnalogueFilter.m_step = step;
  (*(this->pd1).super_ChAnalogueFilter._vptr_ChAnalogueFilter[2])(&this->pd1);
  (this->pt1).m_T1 = T1;
  (this->pt1).m_Kpt1 = Kp;
  (this->pt1).super_ChAnalogueFilter.m_step = step;
  (*(this->pt1).super_ChAnalogueFilter._vptr_ChAnalogueFilter[2])(&this->pt1);
  (*(this->super_ChAnalogueFilter)._vptr_ChAnalogueFilter[2])(this);
  return;
}

Assistant:

void ChFilterPDT1::Config(double step, double Td1, double T1, double Kp) {
    m_step = step;
    pd1.Config(step, Td1);
    pt1.Config(step, T1, Kp);
    Reset();
}